

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::getMergedDnaSequence
          (AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  shared_count *psVar2;
  char *pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pCVar6;
  iterator __position;
  pointer pmVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  size_t sVar12;
  long lVar13;
  size_type sVar14;
  int iVar15;
  char *__end;
  uint uVar16;
  int iVar17;
  int iVar18;
  _Alloc_hider _Var19;
  AlignmentRecord *pAVar20;
  char *__args;
  int ref_s_pos2;
  int ref_s_pos1;
  int c_pos1;
  int q_pos1;
  AlignmentRecord *local_258;
  int c_pos2;
  int q_pos2;
  AlignmentRecord *local_248;
  undefined1 local_23c [4];
  string qualities;
  vector<char,_std::allocator<char>_> cigar_temp_unrolled;
  string dna;
  string nucigar;
  ShortDnaSequence local_1b8;
  undefined1 local_168 [32];
  element_type *local_148;
  shared_count asStack_140 [2];
  string *local_130;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref;
  vector<char,_std::allocator<char>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  local_258 = (AlignmentRecord *)alignment;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dna,"","");
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&qualities,"","");
  nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar);
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (char *)(local_258->al_sequence1)._M_string_length;
  pcVar3 = (char *)(local_258->al_sequence1).field_2._M_allocated_capacity;
  if (__args != pcVar3) {
    do {
      if (*(int *)(__args + 4) != 0) {
        uVar16 = 0;
        do {
          if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&cigar_temp_unrolled,
                       (iterator)
                       cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args;
            cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < *(uint *)(__args + 4));
      }
      __args = __args + 8;
    } while (__args != pcVar3);
  }
  pcVar4 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar15 = 0;
  iVar17 = 0;
  if (pcVar4 != pcVar5) {
    iVar17 = (int)pcVar5 - (int)pcVar4;
    lVar13 = 0;
    do {
      if ((pcVar4[lVar13] != 'S') && (pcVar4[lVar13] != 'H')) {
        iVar17 = (int)lVar13;
        break;
      }
      lVar8 = lVar13 + 1;
      lVar13 = lVar13 + 1;
    } while (pcVar4 + lVar8 != pcVar5);
  }
  this_00 = &this->cigar1_unrolled;
  if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar15 = (int)cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      if ((cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13] != 'S') &&
         (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] != 'H')) {
        iVar15 = (int)lVar13;
        break;
      }
      lVar8 = lVar13 + 1;
      lVar13 = lVar13 + 1;
    } while (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar8 !=
             cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar9 = computeRevOffset(this_00);
  local_130 = mainReference;
  iVar10 = computeRevOffset(&cigar_temp_unrolled);
  iVar17 = this->start1 - iVar17;
  iVar9 = iVar9 + this->end1;
  iVar18 = (*(int *)((long)&(local_258->sequence1).backward_qualities.pn.pi_ + 4) - iVar15) + 1;
  pAVar20 = local_258;
  ref_s_pos2 = iVar18;
  ref_s_pos1 = iVar17;
  local_248 = this;
  iVar15 = BamTools::BamAlignment::GetEndPosition(SUB81(local_258,0),false);
  iVar15 = iVar15 + iVar10;
  q_pos1 = 0;
  q_pos2 = 0;
  c_pos1 = 0;
  c_pos2 = 0;
  if ((iVar18 < iVar17) || (iVar15 < iVar9)) {
    if ((iVar18 < iVar17) || (iVar9 < iVar15)) {
      if ((iVar17 < iVar18) || (iVar15 < iVar9)) {
        while (ref_s_pos2 < iVar17) {
          noOverlapMerge((AlignmentRecord *)&q_pos2,(BamAlignment *)local_258,&dna,&qualities,
                         &nucigar,&cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar15) {
          overlapMerge(local_248,(BamAlignment *)local_258,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar9) {
          noOverlapMergeBAM(local_248,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,1);
        }
      }
      else {
        local_23c = (undefined1  [4])iVar15;
        while (ref_s_pos2 < iVar17) {
          noOverlapMerge(pAVar20,(BamAlignment *)local_258,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar9) {
          pAVar20 = local_248;
          overlapMerge(local_248,(BamAlignment *)local_258,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= (int)local_23c) {
          noOverlapMerge(pAVar20,(BamAlignment *)local_258,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
      }
    }
    else {
      while (ref_s_pos1 < iVar18) {
        noOverlapMergeBAM(local_248,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
      while (ref_s_pos1 <= iVar15) {
        overlapMerge(local_248,(BamAlignment *)local_258,&dna,&qualities,&nucigar,
                     &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
      }
      while (ref_s_pos1 <= iVar9) {
        noOverlapMergeBAM(local_248,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
    }
  }
  else {
    local_23c = (undefined1  [4])iVar15;
    while (ref_s_pos1 < iVar18) {
      pAVar20 = local_248;
      noOverlapMergeBAM(local_248,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
    }
    while (ref_s_pos1 <= iVar9) {
      pAVar20 = local_248;
      overlapMerge(local_248,(BamAlignment *)local_258,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                   ,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
    }
    while (ref_s_pos1 <= (int)local_23c) {
      noOverlapMerge(pAVar20,(BamAlignment *)local_258,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                     ,&c_pos2,&q_pos2,&ref_s_pos1);
    }
  }
  pAVar20 = local_248;
  uVar16 = *(int *)((long)&(local_258->sequence1).backward_qualities.pn.pi_ + 4) + 1;
  if (local_248->start1 <= uVar16) {
    uVar16 = local_248->start1;
  }
  local_248->start1 = uVar16;
  uVar11 = BamTools::BamAlignment::GetEndPosition(SUB81(local_258,0),false);
  uVar16 = pAVar20->end1;
  if (pAVar20->end1 < uVar11) {
    uVar16 = uVar11;
  }
  pAVar20->end1 = uVar16;
  pAVar20->single_end = true;
  createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&ref,&nucigar);
  pCVar6 = (pAVar20->cigar1).
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pAVar20->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
  (pAVar20->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
  (pAVar20->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  if ((pCVar6 != (pointer)0x0) &&
     (operator_delete(pCVar6),
     ref.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
     .
     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
     .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
     super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
     (pointer)0x0)) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Var19._M_p = nucigar._M_dataplus._M_p;
  if (qualities._M_string_length == 0) {
    iVar17 = 0;
  }
  else {
    sVar14 = 0;
    iVar17 = 0;
    do {
      iVar17 = iVar17 + qualities._M_dataplus._M_p[sVar14] + -0x21;
      sVar14 = sVar14 + 1;
    } while (qualities._M_string_length != sVar14);
  }
  pAVar20->phred_sum1 = iVar17;
  pcVar4 = (pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar4) {
    (pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  if (nucigar._M_string_length != 0) {
    sVar14 = 0;
    do {
      ref.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(ref.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                             .
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                             .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                             super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                             _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,_Var19._M_p[sVar14]);
      __position._M_current =
           (pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)this_00,__position,(char *)&ref);
      }
      else {
        *__position._M_current = _Var19._M_p[sVar14];
        ppcVar1 = &(pAVar20->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      sVar14 = sVar14 + 1;
    } while (nucigar._M_string_length != sVar14);
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_c8,this_00);
  iVar17 = *(int *)((long)&(local_258->sequence1).backward_qualities.pn.pi_ + 4);
  _Var19 = qualities._M_dataplus;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,qualities._M_dataplus._M_p,
             qualities._M_dataplus._M_p + qualities._M_string_length);
  referenceString(&ref,(AlignmentRecord *)_Var19._M_p,&local_c8,iVar17,&dna,&local_50,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pAVar20->strand1 == false) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,dna._M_dataplus._M_p,dna._M_dataplus._M_p + dna._M_string_length)
    ;
    complement((string *)local_168,&local_70);
    ShortDnaSequence::ShortDnaSequence(&local_1b8,(string *)local_168,&qualities);
    if ((pointer)local_1b8.forward.pn.pi_ != (pointer)0x0) {
      LOCK();
      (local_1b8.forward.pn.pi_)->use_count_ = (local_1b8.forward.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_148 = (pAVar20->sequence1).forward.px;
    asStack_140[0].pi_ = (pAVar20->sequence1).forward.pn.pi_;
    (pAVar20->sequence1).forward.px = local_1b8.forward.px;
    (pAVar20->sequence1).forward.pn.pi_ = local_1b8.forward.pn.pi_;
    boost::detail::shared_count::~shared_count(asStack_140);
    if (local_1b8.forward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1b8.forward_qualities.pn.pi_)->use_count_ =
           (local_1b8.forward_qualities.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_148 = (pAVar20->sequence1).forward_qualities.px;
    asStack_140[0].pi_ = (pAVar20->sequence1).forward_qualities.pn.pi_;
    (pAVar20->sequence1).forward_qualities.px = local_1b8.forward_qualities.px;
    (pAVar20->sequence1).forward_qualities.pn.pi_ = local_1b8.forward_qualities.pn.pi_;
    boost::detail::shared_count::~shared_count(asStack_140);
    if (local_1b8.backward.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)((long)local_1b8.backward.pn.pi_ + 8) =
           *(uint_least32_t *)((long)local_1b8.backward.pn.pi_ + 8) + 1;
      UNLOCK();
    }
    local_148 = (pAVar20->sequence1).backward.px;
    asStack_140[0].pi_ = (pAVar20->sequence1).backward.pn.pi_;
    (pAVar20->sequence1).backward.px = local_1b8.backward.px;
    (pAVar20->sequence1).backward.pn.pi_ = local_1b8.backward.pn.pi_;
    boost::detail::shared_count::~shared_count(asStack_140);
    if (local_1b8.backward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1b8.backward_qualities.pn.pi_)->use_count_ =
           (local_1b8.backward_qualities.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_148 = (pAVar20->sequence1).backward_qualities.px;
    asStack_140[0].pi_ = (pAVar20->sequence1).backward_qualities.pn.pi_;
    (pAVar20->sequence1).backward_qualities.px = local_1b8.backward_qualities.px;
    (pAVar20->sequence1).backward_qualities.pn.pi_ = local_1b8.backward_qualities.pn.pi_;
    boost::detail::shared_count::~shared_count(asStack_140);
    ShortDnaSequence::~ShortDnaSequence(&local_1b8);
    if ((element_type *)local_168._0_8_ != (element_type *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p +
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_string_length);
    complement((string *)&local_1b8,&local_90);
    std::__cxx11::string::operator=((string *)&pAVar20->reference_seq1,(string *)&local_1b8);
    psVar2 = &local_1b8.forward.pn;
    if ((shared_count *)local_1b8._vptr_ShortDnaSequence != psVar2) {
      operator_delete(local_1b8._vptr_ShortDnaSequence);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p +
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_string_length);
    complement((string *)&local_1b8,&local_b0);
    std::__cxx11::string::operator=((string *)&pAVar20->alignSequence1,(string *)&local_1b8);
    if ((shared_count *)local_1b8._vptr_ShortDnaSequence != psVar2) {
      operator_delete(local_1b8._vptr_ShortDnaSequence);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    ShortDnaSequence::ShortDnaSequence(&local_1b8,&dna,&qualities);
    if ((pointer)local_1b8.forward.pn.pi_ != (pointer)0x0) {
      LOCK();
      (local_1b8.forward.pn.pi_)->use_count_ = (local_1b8.forward.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_168._0_8_ = (pAVar20->sequence1).forward.px;
    local_168._8_8_ = (pAVar20->sequence1).forward.pn.pi_;
    (pAVar20->sequence1).forward.px = local_1b8.forward.px;
    (pAVar20->sequence1).forward.pn.pi_ = local_1b8.forward.pn.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_168 + 8));
    if (local_1b8.forward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1b8.forward_qualities.pn.pi_)->use_count_ =
           (local_1b8.forward_qualities.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_168._0_8_ = (pAVar20->sequence1).forward_qualities.px;
    local_168._8_8_ = (pAVar20->sequence1).forward_qualities.pn.pi_;
    (pAVar20->sequence1).forward_qualities.px = local_1b8.forward_qualities.px;
    (pAVar20->sequence1).forward_qualities.pn.pi_ = local_1b8.forward_qualities.pn.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_168 + 8));
    if (local_1b8.backward.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)((long)local_1b8.backward.pn.pi_ + 8) =
           *(uint_least32_t *)((long)local_1b8.backward.pn.pi_ + 8) + 1;
      UNLOCK();
    }
    local_168._0_8_ = (pAVar20->sequence1).backward.px;
    local_168._8_8_ = (pAVar20->sequence1).backward.pn.pi_;
    (pAVar20->sequence1).backward.px = local_1b8.backward.px;
    (pAVar20->sequence1).backward.pn.pi_ = local_1b8.backward.pn.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_168 + 8));
    if (local_1b8.backward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1b8.backward_qualities.pn.pi_)->use_count_ =
           (local_1b8.backward_qualities.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_168._0_8_ = (pAVar20->sequence1).backward_qualities.px;
    local_168._8_8_ = (pAVar20->sequence1).backward_qualities.pn.pi_;
    (pAVar20->sequence1).backward_qualities.px = local_1b8.backward_qualities.px;
    (pAVar20->sequence1).backward_qualities.pn.pi_ = local_1b8.backward_qualities.pn.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_168 + 8));
    ShortDnaSequence::~ShortDnaSequence(&local_1b8);
    std::__cxx11::string::_M_assign((string *)&pAVar20->reference_seq1);
    std::__cxx11::string::_M_assign((string *)&pAVar20->alignSequence1);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&pAVar20->qualityList1,(vector<int,_std::allocator<int>_> *)&ref);
  sVar12 = ShortDnaSequence::size(&pAVar20->sequence1);
  pAVar20->length_incl_deletions1 = (int)sVar12;
  sVar12 = ShortDnaSequence::size(&pAVar20->sequence1);
  pAVar20->length_incl_longdeletions1 = (int)sVar12;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_1b8,pAVar20);
  pmVar7 = (pAVar20->cov_pos).
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pAVar20->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1b8._vptr_ShortDnaSequence;
  (pAVar20->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_1b8.forward.px;
  (pAVar20->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8.forward.pn.pi_;
  local_1b8._vptr_ShortDnaSequence = (_func_int **)0x0;
  local_1b8.forward.px = (element_type *)0x0;
  local_1b8.forward.pn.pi_ = (sp_counted_base *)0x0;
  if ((pmVar7 != (pointer)0x0) &&
     (operator_delete(pmVar7), local_1b8._vptr_ShortDnaSequence != (_func_int **)0x0)) {
    operator_delete(local_1b8._vptr_ShortDnaSequence);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &ref.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &ref.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (ref.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
    operator_delete(nucigar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualities._M_dataplus._M_p != &qualities.field_2) {
    operator_delete(qualities._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dna._M_dataplus._M_p != &dna.field_2) {
    operator_delete(dna._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AlignmentRecord::getMergedDnaSequence(const BamTools::BamAlignment& alignment,string & mainReference){
        std::string dna = "";
        std::string qualities = "";
        std::string nucigar = "";
        std::vector<char> cigar_temp_unrolled;
        //vector of CigarOp
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar_temp_unrolled.push_back(it.Type);
            }
        }
        //get starting position and ending position according to ref position, paying attention to clipped bases
        int offset_f1 = computeOffset(this->cigar1_unrolled);
        int offset_f2 = computeOffset(cigar_temp_unrolled);
        int offset_b1 = computeRevOffset(this->cigar1_unrolled);
        int offset_b2 = computeRevOffset(cigar_temp_unrolled);

        //updated ref position including clips
        int ref_s_pos1 = this->start1-offset_f1;
        int ref_e_pos1 = this->end1+offset_b1;
        int ref_s_pos2 = alignment.Position+1-offset_f2;
        int ref_e_pos2 = alignment.GetEndPosition()+offset_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_pos2 = 0;
        //4 cases of different overlaps
        //------------
        //     ------------
        if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos1);
            }
        }//------------------------------
            //           ----------
         else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            //         ----------
            //--------------------------
        } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            //           --------------------
            //---------------------
        } else {
            assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos2,1);
            }
        }
        this->start1 = std::min(this->start1,(unsigned int)alignment.Position+1);
        this->end1=std::max((unsigned int)alignment.GetEndPosition(),this->end1);
        this->single_end= true;
        this->cigar1 = createCigar(nucigar);

        this->phred_sum1=phred_sum(qualities);

        this->cigar1_unrolled.clear();
        for (char i : nucigar){
            this->cigar1_unrolled.push_back(i);
        }

        //NoMe Additions
        std::tuple<string,string,vector<int>> ref = referenceString(this->getCigar1Unrolled(),alignment.Position,dna,qualities,mainReference);
        if(!this->strand1){
           this->sequence1 = ShortDnaSequence(complement(dna), qualities);
           this->reference_seq1=complement(std::get<0>(ref));
           this->alignSequence1=complement(std::get<1>(ref));
            this->qualityList1 = std::get<2>(ref);
        }else{
           this->sequence1=ShortDnaSequence(dna,qualities);
           this->reference_seq1=std::get<0>(ref);
           this->alignSequence1=std::get<1>(ref);
            this->qualityList1 = std::get<2>(ref);
        }
        //fill out thr frs ffs thing here

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();
        //End NoMe Additions
        //this->strandInfo = this->determineStrand(this->alignSequence1,this->reference_seq1);
        this->cov_pos = this->coveredPositions();
}